

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __pid_t _Var1;
  ostream *poVar2;
  int __sig;
  string *psVar3;
  code *__stat_loc;
  MyProcessEnvironment *environment;
  allocator local_5f1;
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [32];
  undefined1 local_5a8 [8];
  MyProcess env_example;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [39];
  allocator local_451;
  string local_450 [32];
  undefined1 local_430 [8];
  MyProcessEnvironment env;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [32];
  undefined1 local_388 [8];
  MyProcess kill_example;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [32];
  undefined1 local_288 [8];
  MyProcess pipe_output;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  MyProcess pipe_input;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [55];
  allocator local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  MyProcess process;
  char **argv_local;
  int argc_local;
  
  process.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"redirection_example",&local_c1);
  MyProcess::MyProcess((MyProcess *)local_a0,(string *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"../Test/In/redirection_in.txt",&local_f9);
  MyProcess::set_input_file((MyProcess *)local_a0,(string *)local_f8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"arg1 arg2 arg3",&local_121);
  MyProcess::set_arguments((MyProcess *)local_a0,(string *)local_120);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_148,"../Test/Out/redirection_out.txt",
             (allocator *)
             ((long)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  psVar3 = (string *)local_148;
  MyProcess::set_output_file((MyProcess *)local_a0,psVar3);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipe_input.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  MyProcess::start((MyProcess *)local_a0);
  _Var1 = MyProcess::wait((MyProcess *)local_a0,psVar3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f8,"pipe_input",
             (allocator *)
             ((long)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  MyProcess::MyProcess((MyProcess *)local_1d8,(string *)local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipe_output.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"pipe_output",&local_2a9);
  MyProcess::MyProcess((MyProcess *)local_288,(string *)local_2a8);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"../Test/In/pipe_in.txt",&local_2d1);
  MyProcess::set_input_file((MyProcess *)local_1d8,(string *)local_2d0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  MyProcess::set_output_process((MyProcess *)local_1d8,(MyProcess *)local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2f8,"../Test/Out/pipe_out.txt",
             (allocator *)
             ((long)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  psVar3 = (string *)local_2f8;
  MyProcess::set_output_file((MyProcess *)local_288,psVar3);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&kill_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  MyProcess::start((MyProcess *)local_1d8);
  MyProcess::start((MyProcess *)local_288);
  _Var1 = MyProcess::wait((MyProcess *)local_1d8,psVar3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
  __stat_loc = std::endl<char,std::char_traits<char>>;
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  _Var1 = MyProcess::wait((MyProcess *)local_288,__stat_loc);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"kill_example",&local_3a9);
  MyProcess::MyProcess((MyProcess *)local_388,(string *)local_3a8);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"../Test/In/kill_in.txt",&local_3d1);
  MyProcess::set_input_file((MyProcess *)local_388,(string *)local_3d0);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3f8,"../Test/Out/kill_out.txt",
             (allocator *)((long)&env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  psVar3 = (string *)local_3f8;
  MyProcess::set_output_file((MyProcess *)local_388,psVar3);
  _Var1 = (__pid_t)psVar3;
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  MyProcess::start((MyProcess *)local_388);
  sleep(5);
  MyProcess::kill((MyProcess *)local_388,_Var1,__sig);
  MyProcessEnvironment::MyProcessEnvironment((MyProcessEnvironment *)local_430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"key1",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"value1",&local_479);
  MyProcessEnvironment::set
            ((MyProcessEnvironment *)local_430,(string *)local_450,(string *)local_478);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"key2",&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"value2",&local_4c9);
  MyProcessEnvironment::set
            ((MyProcessEnvironment *)local_430,(string *)local_4a0,(string *)local_4c8);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"key3",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_518,"value3",
             (allocator *)
             ((long)&env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  MyProcessEnvironment::set
            ((MyProcessEnvironment *)local_430,(string *)local_4f0,(string *)local_518);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&env_example.env.env._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c8,"environment_vars_example",&local_5c9);
  MyProcess::MyProcess((MyProcess *)local_5a8,(string *)local_5c8);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f0,"../Test/Out/env_example_out.txt",&local_5f1);
  MyProcess::set_output_file((MyProcess *)local_5a8,(string *)local_5f0);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  environment = (MyProcessEnvironment *)local_430;
  MyProcess::set_environment((MyProcess *)local_5a8,environment);
  MyProcess::start((MyProcess *)local_5a8);
  _Var1 = MyProcess::wait((MyProcess *)local_5a8,environment);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_Var1);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  MyProcess::~MyProcess((MyProcess *)local_5a8);
  MyProcessEnvironment::~MyProcessEnvironment((MyProcessEnvironment *)local_430);
  MyProcess::~MyProcess((MyProcess *)local_388);
  MyProcess::~MyProcess((MyProcess *)local_288);
  MyProcess::~MyProcess((MyProcess *)local_1d8);
  MyProcess::~MyProcess((MyProcess *)local_a0);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    MyProcess process("redirection_example");
    process.set_input_file("../Test/In/redirection_in.txt");
    process.set_arguments("arg1 arg2 arg3");
    process.set_output_file("../Test/Out/redirection_out.txt");
    process.start();
    std::cout << process.wait() << std::endl;


    MyProcess pipe_input("pipe_input");
    MyProcess pipe_output("pipe_output");
    pipe_input.set_input_file("../Test/In/pipe_in.txt");
    pipe_input.set_output_process(pipe_output);
    pipe_output.set_output_file("../Test/Out/pipe_out.txt");

    pipe_input.start();
    pipe_output.start();
    std::cout << pipe_input.wait() << std::endl;
    std::cout << pipe_output.wait() << std::endl;

    MyProcess kill_example("kill_example");
    kill_example.set_input_file("../Test/In/kill_in.txt");
    kill_example.set_output_file("../Test/Out/kill_out.txt");
    kill_example.start();

#if defined(__linux__) || defined(__APPLE__)
    sleep(5);
#elif _WIN32
    Sleep(5000);
#endif

    kill_example.kill();

    MyProcessEnvironment env;
    env.set("key1", "value1");
    env.set("key2", "value2");
    env.set("key3", "value3");

    MyProcess env_example("environment_vars_example");
    env_example.set_output_file("../Test/Out/env_example_out.txt");
    env_example.set_environment(env);

    env_example.start();
    std::cout << env_example.wait() << std::endl;

    return 0;
}